

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.h
# Opt level: O0

void __thiscall pbrt::SampledWavelengths::TerminateSecondary(SampledWavelengths *this)

{
  bool bVar1;
  float *pfVar2;
  SampledWavelengths *in_RDI;
  int i;
  int local_c;
  
  bVar1 = SecondaryTerminated(in_RDI);
  if (!bVar1) {
    for (local_c = 1; local_c < 4; local_c = local_c + 1) {
      pfVar2 = pstd::array<float,_4>::operator[](&in_RDI->pdf,(long)local_c);
      *pfVar2 = 0.0;
    }
    pfVar2 = pstd::array<float,_4>::operator[](&in_RDI->pdf,0);
    *pfVar2 = *pfVar2 / 4.0;
  }
  return;
}

Assistant:

PBRT_CPU_GPU
    void TerminateSecondary() {
        if (SecondaryTerminated())
            return;
        // Update wavelength probabilities for termination
        for (int i = 1; i < NSpectrumSamples; ++i)
            pdf[i] = 0;
        pdf[0] /= NSpectrumSamples;
    }